

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_artifact(parser *p)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  curse *pcVar5;
  artifact *paVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  void *pvVar9;
  object *poVar10;
  object_kind *poVar11;
  uint16_t uVar12;
  angband_constants *paVar13;
  bitflag *pbVar14;
  ulong uVar15;
  long lVar16;
  
  z_info->a_max = 0;
  pvVar9 = parser_priv(p);
  paVar13 = z_info;
  uVar12 = z_info->a_max;
  for (; pvVar9 != (void *)0x0; pvVar9 = *(void **)((long)pvVar9 + 0x18)) {
    uVar12 = uVar12 + 1;
    paVar13->a_max = uVar12;
  }
  a_info = (artifact *)mem_zalloc((ulong)uVar12 * 0x140 + 0x140);
  aup_info = (artifact_upkeep *)mem_zalloc((ulong)z_info->a_max * 8 + 8);
  uVar15 = (ulong)z_info->a_max;
  pvVar9 = parser_priv(p);
  lVar16 = uVar15 * 0x140 + 0x140;
  while( true ) {
    if (pvVar9 == (void *)0x0) {
      z_info->a_max = z_info->a_max + 1;
      wVar7 = tval_find_idx("none");
      wVar8 = lookup_sval(wVar7,"<unknown item>");
      unknown_item_kind = lookup_kind(wVar7,wVar8);
      wVar8 = lookup_sval(wVar7,"<unknown treasure>");
      unknown_gold_kind = lookup_kind(wVar7,wVar8);
      wVar8 = lookup_sval(wVar7,"<pile>");
      pile_kind = lookup_kind(wVar7,wVar8);
      wVar8 = lookup_sval(wVar7,"<curse object>");
      curse_object_kind = lookup_kind(wVar7,wVar8);
      wVar7 = tval_find_idx("none");
      wVar7 = lookup_sval(wVar7,"<curse object>");
      lVar16 = 0x50;
      for (uVar15 = 1; poVar11 = curse_object_kind, pcVar5 = curses, uVar15 < z_info->curse_max;
          uVar15 = uVar15 + 1) {
        puVar2 = *(undefined8 **)(curses->conflict_flags + lVar16 + -0x28);
        *puVar2 = curse_object_kind;
        *(char *)((long)puVar2 + 0x3d) = (char)wVar7;
        poVar10 = (object *)puVar2[5];
        if (poVar10 == (object *)0x0) {
          poVar10 = object_new();
          *(object **)(*(long *)(pcVar5->conflict_flags + lVar16 + -0x28) + 0x28) = poVar10;
          poVar11 = curse_object_kind;
        }
        poVar10->kind = poVar11;
        *(char *)(*(long *)(*(long *)(curses->conflict_flags + lVar16 + -0x28) + 0x28) + 0x3d) =
             (char)wVar7;
        poVar10->notice = poVar10->notice | 2;
        lVar16 = lVar16 + 0x38;
      }
      lVar16 = 0x260;
      paVar13 = z_info;
      for (uVar15 = 1; paVar6 = a_info, uVar15 < paVar13->a_max; uVar15 = uVar15 + 1) {
        poVar11 = lookup_kind(*(wchar_t *)((long)a_info + lVar16 + -0x100),
                              *(wchar_t *)((long)a_info + lVar16 + -0xfc));
        paVar13 = z_info;
        if ((uint)z_info->ordinary_kind_max < poVar11->kidx) {
          poVar11->level = *(wchar_t *)(paVar6->flags + lVar16 + -0x6c);
          poVar11->effect = *(effect **)(paVar6->flags + lVar16 + -0x4c);
          poVar11->effect_msg = *(char **)(paVar6->flags + lVar16 + -0x44);
          if (poVar11->tval != L'\x13') {
            uVar3 = *(undefined8 *)(paVar6->flags + lVar16 + -0x3c);
            uVar4 = *(undefined8 *)(paVar6->flags + lVar16 + -0x3c + 8);
            (poVar11->time).base = (int)uVar3;
            (poVar11->time).dice = (int)((ulong)uVar3 >> 0x20);
            (poVar11->time).sides = (int)uVar4;
            (poVar11->time).m_bonus = (int)((ulong)uVar4 >> 0x20);
          }
        }
        lVar16 = lVar16 + 0x140;
      }
      parser_destroy(p);
      return 0;
    }
    if ((long)uVar15 < 1) break;
    memcpy(a_info[-1].flags + lVar16 + -0x3c,pvVar9,0x140);
    *(uint32_t *)((long)a_info + lVar16 + -0x130) = (uint32_t)uVar15;
    pvVar1 = *(void **)((long)pvVar9 + 0x18);
    pbVar14 = a_info->flags + lVar16 + -0x3c;
    if (z_info->a_max <= uVar15) {
      pbVar14 = (bitflag *)0x0;
    }
    *(bitflag **)((long)a_info + lVar16 + -0x128) = pbVar14;
    mem_free(pvVar9);
    aup_info[uVar15].aidx = (uint32_t)uVar15;
    uVar15 = uVar15 - 1;
    lVar16 = lVar16 + -0x140;
    pvVar9 = pvVar1;
  }
  __assert_fail("aidx > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-init.c"
                ,0xcc0,"errr finish_parse_artifact(struct parser *)");
}

Assistant:

static errr finish_parse_artifact(struct parser *p) {
	struct artifact *a, *n;
	int none, aidx;

	/* Scan the list for the max id */
	z_info->a_max = 0;
	a = parser_priv(p);
	while (a) {
		z_info->a_max++;
		a = a->next;
	}

	/* Allocate the direct access list and copy the data to it */
	a_info = mem_zalloc((z_info->a_max + 1) * sizeof(*a));
	aup_info = mem_zalloc((z_info->a_max + 1) * sizeof(*aup_info));
	aidx = z_info->a_max;
	for (a = parser_priv(p); a; a = n, aidx--) {
		assert(aidx > 0);

		memcpy(&a_info[aidx], a, sizeof(*a));
		a_info[aidx].aidx = aidx;
		n = a->next;
		a_info[aidx].next = (aidx < z_info->a_max) ?
			&a_info[aidx + 1] : NULL;
		mem_free(a);

		aup_info[aidx].aidx = aidx;
	}
	z_info->a_max += 1;

	/* Now we're done with object kinds, deal with object-like things... */
	none = tval_find_idx("none");
	unknown_item_kind = lookup_kind(none, lookup_sval(none, "<unknown item>"));
	unknown_gold_kind = lookup_kind(none,
									lookup_sval(none, "<unknown treasure>"));
	pile_kind = lookup_kind(none, lookup_sval(none, "<pile>"));
	curse_object_kind = lookup_kind(none, lookup_sval(none, "<curse object>"));
	write_curse_kinds();

	/* ..and fill in all object data */
	for (aidx = 1; aidx < z_info->a_max; aidx++) {
		struct artifact *art = &a_info[aidx];
		struct object_kind *kind = lookup_kind(art->tval, art->sval);
		if (kind->kidx > z_info->ordinary_kind_max) {
			kind->level = art->level;
			kind->effect = art->effect;
			kind->effect_msg = art->effect_msg;
			/*
			 * Timeout for a light already handled in
			 * parse_artifact_time().
			 */
			if (kind->tval != TV_LIGHT) {
				kind->time = art->time;
			}
		}
	}

	parser_destroy(p);
	return 0;
}